

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_cbs_auth.c
# Opt level: O0

AUTHENTICATION_HANDLE authentication_create(AUTHENTICATION_CONFIG *config)

{
  LOGGER_LOG p_Var1;
  AUTHENTICATION_HANDLE authentication_handle;
  char *pcVar2;
  STRING_HANDLE pSVar3;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  AUTHENTICATION_INSTANCE_conflict *instance;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  AUTHENTICATION_HANDLE result;
  AUTHENTICATION_CONFIG *config_local;
  
  if (config == (AUTHENTICATION_CONFIG *)0x0) {
    l = (LOGGER_LOG)0x0;
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_cbs_auth.c"
                ,"authentication_create",0x1d1,1,"authentication_create failed (config is NULL)");
    }
  }
  else if (config->authorization_module == (IOTHUB_AUTHORIZATION_HANDLE)0x0) {
    l = (LOGGER_LOG)0x0;
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_cbs_auth.c"
                ,"authentication_create",0x1d6,1,
                "authentication_create failed (config->authorization_module is NULL)");
    }
  }
  else if (config->iothub_host_fqdn == (char *)0x0) {
    l = (LOGGER_LOG)0x0;
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_cbs_auth.c"
                ,"authentication_create",0x1db,1,
                "authentication_create failed (config->iothub_host_fqdn is NULL)");
    }
  }
  else if (config->on_state_changed_callback == (ON_AUTHENTICATION_STATE_CHANGED_CALLBACK)0x0) {
    l = (LOGGER_LOG)0x0;
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_cbs_auth.c"
                ,"authentication_create",0x1e0,1,
                "authentication_create failed (config->on_state_changed_callback is NULL)");
    }
  }
  else {
    authentication_handle = (AUTHENTICATION_HANDLE)malloc(0x70);
    if (authentication_handle == (AUTHENTICATION_HANDLE)0x0) {
      l = (LOGGER_LOG)0x0;
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_cbs_auth.c"
                  ,"authentication_create",0x1e9,1,"authentication_create failed (malloc failed)");
      }
    }
    else {
      memset(authentication_handle,0,0x70);
      pcVar2 = IoTHubClient_Auth_Get_DeviceId(config->authorization_module);
      authentication_handle->device_id = pcVar2;
      if (pcVar2 == (char *)0x0) {
        l = (LOGGER_LOG)0x0;
        p_Var1 = xlogging_get_log_function();
        if (p_Var1 != (LOGGER_LOG)0x0) {
          (*p_Var1)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_cbs_auth.c"
                    ,"authentication_create",0x1f2,1,
                    "authentication_create failed (config->device_id could not be copied; STRING_construct failed)"
                   );
        }
      }
      else {
        pSVar3 = STRING_construct(config->iothub_host_fqdn);
        authentication_handle->iothub_host_fqdn = pSVar3;
        if (pSVar3 == (STRING_HANDLE)0x0) {
          l = (LOGGER_LOG)0x0;
          p_Var1 = xlogging_get_log_function();
          if (p_Var1 != (LOGGER_LOG)0x0) {
            (*p_Var1)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_cbs_auth.c"
                      ,"authentication_create",0x1f7,1,
                      "authentication_create failed (config->iothub_host_fqdn could not be copied; STRING_construct failed)"
                     );
          }
        }
        else {
          authentication_handle->state = AUTHENTICATION_STATE_STOPPED;
          pcVar2 = IoTHubClient_Auth_Get_ModuleId(config->authorization_module);
          authentication_handle->module_id = pcVar2;
          authentication_handle->on_state_changed_callback = config->on_state_changed_callback;
          authentication_handle->on_state_changed_callback_context =
               config->on_state_changed_callback_context;
          authentication_handle->on_error_callback = config->on_error_callback;
          authentication_handle->on_error_callback_context = config->on_error_callback_context;
          authentication_handle->cbs_request_timeout_secs = 0xffffffff;
          authentication_handle->authorization_module = config->authorization_module;
          l = (LOGGER_LOG)authentication_handle;
        }
      }
      if (l == (LOGGER_LOG)0x0) {
        authentication_destroy(authentication_handle);
      }
    }
  }
  return (AUTHENTICATION_HANDLE)l;
}

Assistant:

AUTHENTICATION_HANDLE authentication_create(const AUTHENTICATION_CONFIG* config)
{
    AUTHENTICATION_HANDLE result;

    if (config == NULL)
    {
        result = NULL;
        LogError("authentication_create failed (config is NULL)");
    }
    else if (config->authorization_module == NULL)
    {
        result = NULL;
        LogError("authentication_create failed (config->authorization_module is NULL)");
    }
    else if (config->iothub_host_fqdn == NULL)
    {
        result = NULL;
        LogError("authentication_create failed (config->iothub_host_fqdn is NULL)");
    }
    else if (config->on_state_changed_callback == NULL)
    {
        result = NULL;
        LogError("authentication_create failed (config->on_state_changed_callback is NULL)");
    }
    else
    {
        AUTHENTICATION_INSTANCE* instance;

        if ((instance = (AUTHENTICATION_INSTANCE*)malloc(sizeof(AUTHENTICATION_INSTANCE))) == NULL)
        {
            result = NULL;
            LogError("authentication_create failed (malloc failed)");
        }
        else
        {
            memset(instance, 0, sizeof(AUTHENTICATION_INSTANCE));

            if ((instance->device_id = IoTHubClient_Auth_Get_DeviceId(config->authorization_module) ) == NULL)
            {
                result = NULL;
                LogError("authentication_create failed (config->device_id could not be copied; STRING_construct failed)");
            }
            else if ((instance->iothub_host_fqdn = STRING_construct(config->iothub_host_fqdn)) == NULL)
            {
                result = NULL;
                LogError("authentication_create failed (config->iothub_host_fqdn could not be copied; STRING_construct failed)");
            }
            else
            {
                instance->state = AUTHENTICATION_STATE_STOPPED;

                instance->module_id = IoTHubClient_Auth_Get_ModuleId(config->authorization_module);

                instance->on_state_changed_callback = config->on_state_changed_callback;
                instance->on_state_changed_callback_context = config->on_state_changed_callback_context;

                instance->on_error_callback = config->on_error_callback;
                instance->on_error_callback_context = config->on_error_callback_context;

                instance->cbs_request_timeout_secs = DEFAULT_CBS_REQUEST_TIMEOUT_SECS;

                instance->authorization_module = config->authorization_module;

                result = (AUTHENTICATION_HANDLE)instance;
            }

            if (result == NULL)
            {
                authentication_destroy((AUTHENTICATION_HANDLE)instance);
            }
        }
    }

    return result;
}